

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O1

void __thiscall amrex::TagBoxArray::setVal(TagBoxArray *this,BoxArray *ba,TagVal val)

{
  BaseFab<char> *this_00;
  pointer ppVar1;
  int *piVar2;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range3;
  pair<int,_amrex::Box> *is;
  pointer ppVar3;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  MFIter mfi;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_118;
  FabArray<amrex::TagBox> *local_100;
  BoxArray *local_f8;
  MFIter local_f0;
  Box local_8c;
  Array4<char> local_70;
  
  local_118.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = &this->super_FabArray<amrex::TagBox>;
  local_f8 = ba;
  MFIter::MFIter(&local_f0,(FabArrayBase *)this,'\0');
  if (local_f0.currentIndex < local_f0.endIndex) {
    do {
      piVar2 = &local_f0.currentIndex;
      if (local_f0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar2 = ((local_f0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_f0.currentIndex;
      }
      this_00 = &(local_100->m_fabs_v).
                 super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar2]->super_BaseFab<char>;
      FabArray<amrex::TagBox>::array<amrex::TagBox,_0>(&local_70,local_100,&local_f0);
      FabArrayBase::fabbox
                (&local_8c,local_f0.fabArray,
                 ((local_f0.index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_f0.currentIndex]);
      BoxArray::intersections(local_f8,&local_8c,&local_118);
      ppVar1 = local_118.
               super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar3 = local_118.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1
          ) {
        local_8c.smallend.vect[0]._0_1_ = (undefined1)val;
        BaseFab<char>::setVal<(amrex::RunOn)1>
                  (this_00,(char *)&local_8c,&ppVar3->second,(DestComp)0x0,(NumComps)0x1);
      }
      MFIter::operator++(&local_f0);
    } while (local_f0.currentIndex < local_f0.endIndex);
  }
  MFIter::~MFIter(&local_f0);
  if (local_118.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
TagBoxArray::setVal (const BoxArray& ba, TagBox::TagVal val)
{
    Vector<Array4BoxTag<char> > tags;
    bool run_on_gpu = Gpu::inLaunchRegion();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
    {
        std::vector< std::pair<int,Box> > isects;
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            TagBox& fab = (*this)[mfi];
            Array4<char> const& arr = this->array(mfi);
            ba.intersections(mfi.fabbox(), isects);
            for (const auto& is : isects) {
                Box const& b = is.second;
                if (run_on_gpu) {
                    tags.push_back({arr,b});
                } else {
                   fab.setVal<RunOn::Host>(val,b);
                }
            }
        }
    }

#ifdef AMREX_USE_GPU
    amrex::ParallelFor(tags, 1,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int /*n*/, Array4BoxTag<char> const& tag) noexcept
    {
        tag.dfab(i,j,k) = val;
    });
#endif
}